

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::EmptyConstraintPS::EmptyConstraintPS(EmptyConstraintPS *this,EmptyConstraintPS *old)

{
  cpp_dec_float<200U,_int,_void> *in_RSI;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  
  PostStep::PostStep((PostStep *)in_RSI,(PostStep *)in_RDI);
  *(undefined ***)(in_RDI->data)._M_elems = &PTR__EmptyConstraintPS_0089fed8;
  (in_RDI->data)._M_elems[10] = (in_RSI->data)._M_elems[10];
  (in_RDI->data)._M_elems[0xb] = (in_RSI->data)._M_elems[0xb];
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RSI,in_RDI);
  return;
}

Assistant:

EmptyConstraintPS(const EmptyConstraintPS& old)
         : PostStep(old)
         , m_i(old.m_i)
         , m_old_i(old.m_old_i)
         , m_row_obj(old.m_row_obj)
      {}